

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderAngle(char *label,float *v_rad,float v_degrees_min,float v_degrees_max,
                       char *format,ImGuiSliderFlags flags)

{
  bool bVar1;
  float v_deg;
  float local_14;
  
  if (format == (char *)0x0) {
    format = "%.0f deg";
  }
  local_14 = (*v_rad * 360.0) / 6.2831855;
  bVar1 = SliderFloat(label,&local_14,v_degrees_min,v_degrees_max,format,flags);
  *v_rad = (local_14 * 6.2831855) / 360.0;
  return bVar1;
}

Assistant:

bool ImGui::SliderAngle(const char* label, float* v_rad, float v_degrees_min, float v_degrees_max, const char* format, ImGuiSliderFlags flags)
{
    if (format == NULL)
        format = "%.0f deg";
    float v_deg = (*v_rad) * 360.0f / (2 * IM_PI);
    bool value_changed = SliderFloat(label, &v_deg, v_degrees_min, v_degrees_max, format, flags);
    *v_rad = v_deg * (2 * IM_PI) / 360.0f;
    return value_changed;
}